

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_enlarge_seg(REF_CAVITY ref_cavity,REF_INT seg)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT tri_list [2];
  REF_INT ntri;
  REF_BOOL have_cell1;
  REF_BOOL have_cell0;
  REF_CELL tri;
  REF_GRID ref_grid;
  REF_CAVITY pRStack_18;
  REF_INT seg_local;
  REF_CAVITY ref_cavity_local;
  
  tri = (REF_CELL)ref_cavity->ref_grid;
  _have_cell1 = ((REF_GRID)tri)->cell[3];
  ref_grid._4_4_ = seg;
  pRStack_18 = ref_cavity;
  if (((seg < 0) || (ref_cavity->maxseg <= seg)) || (ref_cavity->s2n[seg * 3] == -1)) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",2000,
           "ref_cavity_enlarge_seg","invalid seg");
    ref_cavity_local._4_4_ = 1;
  }
  else {
    uVar1 = ref_cell_list_with2(_have_cell1,ref_cavity->s2n[seg * 3],ref_cavity->s2n[seg * 3 + 1],2,
                                tri_list,&ref_private_macro_code_rss_1);
    if (uVar1 == 0) {
      if (tri_list[0] == 2) {
        uVar1 = ref_list_contains(pRStack_18->tri_list,ref_private_macro_code_rss_1,&ntri);
        if (uVar1 == 0) {
          uVar1 = ref_list_contains(pRStack_18->tri_list,ref_private_macro_code_rss,tri_list + 1);
          if (uVar1 == 0) {
            if (ntri == tri_list[1]) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x7e1,"ref_cavity_enlarge_seg","cavity same seg-tri state");
              ref_cavity_local._4_4_ = 1;
            }
            else if ((ntri == 0) ||
                    (ref_cavity_local._4_4_ =
                          ref_cavity_add_tri(pRStack_18,ref_private_macro_code_rss),
                    ref_cavity_local._4_4_ == 0)) {
              if ((tri_list[1] == 0) ||
                 (ref_cavity_local._4_4_ =
                       ref_cavity_add_tri(pRStack_18,ref_private_macro_code_rss_1),
                 ref_cavity_local._4_4_ == 0)) {
                ref_cavity_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x7e3,"ref_cavity_enlarge_seg",(ulong)ref_cavity_local._4_4_,"add c0");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x7e2,"ref_cavity_enlarge_seg",(ulong)ref_cavity_local._4_4_,"add c1");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x7e0,"ref_cavity_enlarge_seg",(ulong)uVar1,"cell1");
            ref_cavity_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x7dd,"ref_cavity_enlarge_seg",(ulong)uVar1,"cell0");
          ref_cavity_local._4_4_ = uVar1;
        }
      }
      else {
        pRStack_18->state = REF_CAVITY_BOUNDARY_CONSTRAINED;
        ref_cavity_local._4_4_ = 0;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x7d5,"ref_cavity_enlarge_seg",(ulong)uVar1,"tri with2");
      ref_cavity_local._4_4_ = uVar1;
    }
  }
  return ref_cavity_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_enlarge_seg(REF_CAVITY ref_cavity, REF_INT seg) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_BOOL have_cell0, have_cell1;
  REF_INT ntri, tri_list[2];

  RAS(ref_cavity_valid_seg(ref_cavity, seg), "invalid seg");

  RSS(ref_cell_list_with2(tri, ref_cavity_s2n(ref_cavity, 0, seg),
                          ref_cavity_s2n(ref_cavity, 1, seg), 2, &ntri,
                          tri_list),
      "tri with2");
  if (2 != ntri) { /* for nonmanifold wirebody */
    ref_cavity_state(ref_cavity) = REF_CAVITY_BOUNDARY_CONSTRAINED;
    return REF_SUCCESS;
  }

  RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), tri_list[0],
                        &have_cell0),
      "cell0");
  RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), tri_list[1],
                        &have_cell1),
      "cell1");
  if (have_cell0 == have_cell1) THROW("cavity same seg-tri state");
  if (have_cell0) RSS(ref_cavity_add_tri(ref_cavity, tri_list[1]), "add c1");
  if (have_cell1) RSS(ref_cavity_add_tri(ref_cavity, tri_list[0]), "add c0");

  return REF_SUCCESS;
}